

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateDirect(TemporaryObject *this,bool throwIfNotFound)

{
  Reference sourceRef;
  Thread *pTVar1;
  Node *pNVar2;
  StringTable *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar3;
  StringId id;
  ObjectBase *pOVar4;
  vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *this_01;
  reference ppCVar5;
  MethodTable *pMVar6;
  InternalError *pIVar7;
  RuntimeException *pRVar8;
  Thread *args;
  string *local_338;
  StringId local_29c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_251;
  string *local_250;
  string local_248;
  string local_228;
  string local_208;
  iterator local_1e8;
  size_type local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  allocator local_1b9;
  string local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  allocator local_179;
  string local_178;
  Reference local_158;
  ReferenceNode *local_150;
  Reference local_148;
  ReferenceNode *local_140;
  Class *local_138;
  Class *clParent_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *__range4;
  Class *clParent;
  TemporaryObject *local_f8;
  Class **local_f0;
  __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
  local_e8;
  __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
  local_e0;
  __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
  it;
  vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *clParents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  allocator local_a9;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  allocator local_59;
  string local_58;
  Class *local_38;
  Class *cl;
  Class *local_28;
  Class *clTarget;
  TemporaryObject *pTStack_18;
  bool throwIfNotFound_local;
  TemporaryObject *this_local;
  
  clTarget._7_1_ = throwIfNotFound;
  pTStack_18 = this;
  switch(this->type) {
  case Rvalue:
    pOVar4 = Reference::deref<chatra::ObjectBase>(&this->targetRef);
    local_28 = ObjectBase::getClass(pOVar4);
    cl = (Class *)(this->targetRef).node;
    pMVar6 = Class::refMethods(local_28);
    bVar3 = findOnObject(this,(Reference)cl,pMVar6,(Class *)0x0,Invalid);
    if (bVar3) {
      return Succeeded;
    }
    break;
  case Package:
    local_38 = Package::findClass(this->package,this->name);
    if (local_38 != (Class *)0x0) {
      if ((this->hasArgs & 1U) == 0) {
        setClass(this,local_38);
        return Succeeded;
      }
      bVar3 = findConstructor(this,local_38,Invalid);
      if (bVar3) {
        return Succeeded;
      }
    }
    bVar3 = findOnPackage(this,this->package);
    if (bVar3) {
      return Succeeded;
    }
    local_28 = (Class *)0x0;
    break;
  case Class:
    if ((this->hasArgs & 1U) == 0) {
      if (this->node != (Node *)0x0) {
        pTVar1 = this->thread;
        pNVar2 = this->node;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_58,"cannot use element selection operator on a class",&local_59)
        ;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_88);
        errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_58,&local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        std::__cxx11::string::~string((string *)&local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
      pRVar8 = (RuntimeException *)__cxa_allocate_exception(0x10);
      RuntimeException::RuntimeException(pRVar8,UnsupportedOperationException);
      __cxa_throw(pRVar8,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    if ((this->hasName & 1U) == 0) {
      local_29c = Invalid;
    }
    else {
      local_29c = this->name;
    }
    bVar3 = findConstructor(this,this->cl,local_29c);
    if (bVar3) {
      return Succeeded;
    }
    if (this->node != (Node *)0x0) {
      pTVar1 = this->thread;
      pNVar2 = this->node;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"constructor not found",&local_a9);
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c8);
      errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_a8,&local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    pRVar8 = (RuntimeException *)__cxa_allocate_exception(0x10);
    RuntimeException::RuntimeException(pRVar8,MemberNotFoundException);
    __cxa_throw(pRVar8,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  case Constructor:
  case FrameMethod:
  case ObjectMethod:
    pIVar7 = (InternalError *)__cxa_allocate_exception(8);
    memset(pIVar7,0,8);
    InternalError::InternalError(pIVar7);
    __cxa_throw(pIVar7,&InternalError::typeinfo,InternalError::~InternalError);
  default:
    pIVar7 = (InternalError *)__cxa_allocate_exception(8);
    memset(pIVar7,0,8);
    InternalError::InternalError(pIVar7);
    __cxa_throw(pIVar7,&InternalError::typeinfo,InternalError::~InternalError);
  case ScopeRef:
  case ObjectRef:
  case Self:
    pOVar4 = Reference::deref<chatra::ObjectBase>(&this->targetRef);
    local_28 = ObjectBase::getClass(pOVar4);
    sourceRef.node = (this->targetRef).node;
    pMVar6 = Class::refMethods(local_28);
    bVar3 = findOnObject(this,sourceRef,pMVar6,(Class *)0x0,Invalid);
    if (bVar3) {
      return Succeeded;
    }
    break;
  case Super:
    if ((this->hasName & 1U) != 0) {
      it._M_current = (Class **)Class::refDirectParents(this->cl);
      local_e8._M_current =
           (Class **)
           std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::cbegin
                     ((vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *)
                      it._M_current);
      local_f0 = (Class **)
                 std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::cend
                           (it._M_current);
      local_f8 = this;
      local_e0 = std::
                 find_if<__gnu_cxx::__normal_iterator<chatra::Class_const*const*,std::vector<chatra::Class_const*,std::allocator<chatra::Class_const*>>>,chatra::TemporaryObject::evaluateDirect(bool)::__0>
                           (local_e8,(__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
                                      )local_f0,(anon_class_8_1_8991fb9c_for__M_pred)this);
      clParent = (Class *)std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
                          ::cend((vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
                                  *)it._M_current);
      bVar3 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
                          *)&clParent);
      if (bVar3) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
                  ::operator*(&local_e0);
        if ((this->hasArgs & 1U) == 0) {
          setExplicitSuper(this,(this->targetRef).node,*ppCVar5);
          return Succeeded;
        }
        bVar3 = findConstructorCall(this,(this->targetRef).node,*ppCVar5,Invalid);
        if (bVar3) {
          return Succeeded;
        }
      }
    }
    if (((this->hasName & 1U) != 0) && ((this->hasArgs & 1U) != 0)) {
      this_01 = Class::refDirectParents(this->cl);
      __end4 = std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::begin
                         (this_01);
      clParent_1 = (Class *)std::
                            vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::
                            end(this_01);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
                                         *)&clParent_1), bVar3) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
                  ::operator*(&__end4);
        local_138 = *ppCVar5;
        local_140 = (this->targetRef).node;
        bVar3 = findConstructorCall(this,(Reference)local_140,local_138,this->name);
        if (bVar3) {
          return Succeeded;
        }
        __gnu_cxx::
        __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
        ::operator++(&__end4);
      }
    }
    local_148.node = (this->targetRef).node;
    pMVar6 = Class::refSuperMethods(this->cl);
    bVar3 = findOnObject(this,local_148,pMVar6,(Class *)0x0,Invalid);
    if (bVar3) {
      return Succeeded;
    }
    local_28 = this->cl;
    break;
  case ExplicitSuper:
    if (((this->hasName & 1U) != 0) && ((this->hasArgs & 1U) != 0)) {
      local_150 = (this->targetRef).node;
      bVar3 = findConstructorCall(this,(Reference)local_150,this->cl,this->name);
      if (bVar3) {
        return Succeeded;
      }
    }
    local_158.node = (this->targetRef).node;
    pMVar6 = Class::refMethods(this->cl);
    bVar3 = findOnObject(this,local_158,pMVar6,this->cl,Invalid);
    if (bVar3) {
      return Succeeded;
    }
    local_28 = this->cl;
  }
  bVar3 = partialEvaluation(this,0xffffffffffffffff,local_28);
  if (bVar3) {
    this_local._4_4_ = Partial;
  }
  else {
    if ((clTarget._7_1_ & 1) != 0) {
      if (local_28 == (Class *)0x0) {
        pTVar1 = this->thread;
        pNVar2 = this->node;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_178,"expected expression",&local_179);
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_198);
        errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_178,&local_198);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_198);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
      }
      else {
        pTVar1 = this->thread;
        pNVar2 = this->node;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1b8,"no method or member named \"${0}${1}\" in class \"${2}\"",
                   &local_1b9);
        local_250 = &local_248;
        args = this->thread;
        StringTable::ref_abi_cxx11_(local_250,args->sTable,this->name);
        local_250 = &local_228;
        toString_abi_cxx11_(local_250,(chatra *)this->thread->sTable,(StringTable *)&this->args,
                            (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
                            args);
        this_00 = this->thread->sTable;
        local_250 = &local_208;
        id = Class::getName(local_28);
        StringTable::ref_abi_cxx11_(&local_208,this_00,id);
        local_1e8 = &local_248;
        local_1e0 = 3;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_251);
        __l._M_len = local_1e0;
        __l._M_array = local_1e8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1d8,__l,&local_251);
        errorAtNode(&pTVar1->super_IErrorReceiver,Error,pNVar2,&local_1b8,&local_1d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_251);
        local_338 = (string *)&local_1e8;
        do {
          local_338 = local_338 + -1;
          std::__cxx11::string::~string((string *)local_338);
        } while (local_338 != &local_248);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      pRVar8 = (RuntimeException *)__cxa_allocate_exception(0x10);
      RuntimeException::RuntimeException(pRVar8,MemberNotFoundException);
      __cxa_throw(pRVar8,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    this_local._4_4_ = Failed;
  }
  return this_local._4_4_;
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateDirect(bool throwIfNotFound) {
	const Class* clTarget;
	switch (type) {
	case Type::Rvalue:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Package: {
		auto* cl = package->findClass(name);
		if (cl != nullptr) {
			if (!hasArgs) {
				setClass(cl);
				return EvaluationResult::Succeeded;
			}
			if (findConstructor(cl, StringId::Invalid))
				return EvaluationResult::Succeeded;
		}

		if (findOnPackage(package))
			return EvaluationResult::Succeeded;

		clTarget = nullptr;
		break;
	}

	case Type::Class: {
		if (!hasArgs) {
			if (node != nullptr)
				errorAtNode(thread, ErrorLevel::Error, node, "cannot use element selection operator on a class", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (findConstructor(cl, hasName ? name : StringId::Invalid))
			return EvaluationResult::Succeeded;

		if (node != nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "constructor not found", {});
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	case Type::Constructor:
	case Type::FrameMethod:
	case Type::ObjectMethod:
		throw InternalError();

	case Type::ScopeRef:
	case Type::ObjectRef:
	case Type::Self:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Super: {
		// check "super.Class" or "super.Class()" style
		if (hasName) {
			auto& clParents = cl->refDirectParents();
			auto it = std::find_if(clParents.cbegin(), clParents.cend(), [&](const Class* clParent) {
				return clParent->getName() == name; });
			if (it != clParents.cend()) {
				auto* clParent = *it;

				if (!hasArgs) {
					setExplicitSuper(targetRef, clParent);
					return EvaluationResult::Succeeded;
				}
				if (findConstructorCall(targetRef, clParent, StringId::Invalid))
					return EvaluationResult::Succeeded;
			}
		}

		// check "super.constructor()" style
		if (hasName && hasArgs) {
			for (auto* clParent : cl->refDirectParents()) {
				if (findConstructorCall(targetRef, clParent, name))
					return EvaluationResult::Succeeded;
			}
		}

		if (findOnObject(targetRef, cl->refSuperMethods(), nullptr))
			return EvaluationResult::Succeeded;

		clTarget = cl;
		break;
	}

	case Type::ExplicitSuper: {
		// check "super.Class.constructor()" style
		if (hasName && hasArgs && findConstructorCall(targetRef, cl, name))
			return EvaluationResult::Succeeded;

		if (findOnObject(targetRef, cl->refMethods(), cl))
			return EvaluationResult::Succeeded;
		clTarget = cl;
		break;
	}

	default:
		throw InternalError();
	}

	if (partialEvaluation(SIZE_MAX, clTarget))
		return EvaluationResult::Partial;

	if (throwIfNotFound) {
		if (clTarget == nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "expected expression", {});
		else {
			errorAtNode(thread, ErrorLevel::Error, node, R"*(no method or member named "${0}${1}" in class "${2}")*",
					{thread.sTable->ref(name), toString(thread.sTable, args), thread.sTable->ref(clTarget->getName())});
		}
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	return EvaluationResult::Failed;
}